

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O3

Status * __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
EncodeConnectivity(Status *__return_storage_ptr__,
                  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this
                  )

{
  MeshEdgebreakerTraversalPredictiveEncoder *this_00;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *this_01;
  ulong *puVar1;
  CornerTable *pCVar2;
  pointer piVar3;
  pointer pTVar4;
  EncoderBuffer *pEVar5;
  long lVar6;
  _Bit_type *p_Var7;
  iterator __position;
  pointer pIVar8;
  __uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_> __p;
  bool bVar9;
  uint uVar10;
  pointer pIVar11;
  uint uVar12;
  pointer pIVar13;
  pointer pIVar14;
  CornerIndex CVar15;
  uint uVar16;
  ulong uVar17;
  _Head_base<0UL,_draco::CornerTable_*,_false> _Var18;
  uint uVar19;
  vector<bool,_std::allocator<bool>_> *this_02;
  ulong uVar20;
  uint8_t num_attribute_data;
  CornerIndex start_corner;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  init_face_connectivity_corners;
  byte local_a1;
  __uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_> local_a0;
  long local_98;
  long local_90 [2];
  Status *local_80;
  CornerIndex local_74;
  vector<bool,_std::allocator<bool>_> *local_70;
  CornerTable *local_68;
  iterator iStack_60;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *local_58;
  MeshEdgebreakerTraversalPredictiveEncoder *local_50;
  vector<int,_std::allocator<int>_> *local_48;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_40;
  ulong local_38;
  
  local_80 = __return_storage_ptr__;
  if (this->use_single_connectivity_ == true) {
    CreateCornerTableFromAllAttributes((draco *)&local_a0,this->mesh_);
  }
  else {
    CreateCornerTableFromPositionAttribute((draco *)&local_a0,this->mesh_);
  }
  __p._M_t.super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
  super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
       local_a0._M_t.
       super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
       super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  local_a0._M_t.
  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
  super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
       (tuple<draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)
       (_Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)0x0;
  std::__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::reset
            ((__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             &this->corner_table_,
             (pointer)__p._M_t.
                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                      .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)&local_a0);
  pCVar2 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  if ((pCVar2 == (CornerTable *)0x0) ||
     (pCVar2->num_degenerated_faces_ ==
      (int)((ulong)((long)*(pointer *)((long)&(pCVar2->corner_to_vertex_map_).vector_ + 8) -
                    *(long *)&(pCVar2->corner_to_vertex_map_).vector_ >> 2) / 3))) {
    local_a0._M_t.
    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
    super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
         (tuple<draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)local_90;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a0,"All triangles are degenerate.","");
    local_80->code_ = DRACO_ERROR;
    (local_80->error_msg_)._M_dataplus._M_p = (pointer)&(local_80->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80->error_msg_,
               local_a0._M_t.
               super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
               .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,
               local_98 +
               (long)local_a0._M_t.
                     super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                     .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl);
  }
  else {
    this_00 = &this->traversal_encoder_;
    MeshEdgebreakerTraversalPredictiveEncoder::Init
              (this_00,&this->super_MeshEdgebreakerEncoderImplInterface);
    pCVar2 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    EncodeVarint<unsigned_int>
              ((int)((ulong)((long)*(pointer *)((long)&(pCVar2->vertex_corners_).vector_ + 8) -
                            *(long *)&(pCVar2->vertex_corners_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                            ) >> 2) - pCVar2->num_isolated_vertices_,
               (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
    pCVar2 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    EncodeVarint<unsigned_int>
              ((int)((ulong)((long)*(pointer *)((long)&(pCVar2->corner_to_vertex_map_).vector_ + 8)
                             - *(long *)&(pCVar2->corner_to_vertex_map_).vector_ >> 2) / 3) -
               pCVar2->num_degenerated_faces_,
               (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
    local_70 = &this->visited_faces_;
    std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
              (local_70,(ulong)(uint)((int)((ulong)((long)(this->mesh_->faces_).vector_.
                                                                                                                    
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->mesh_->faces_).vector_.
                                                                                                                
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                     -0x55555555),false);
    pCVar2 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    local_a0._M_t.
    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
    super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&(this->pos_encoding_data_).vertex_to_encoded_attribute_value_index_map,
               (long)(int)((ulong)((long)*(pointer *)((long)&(pCVar2->vertex_corners_).vector_ + 8)
                                  - *(long *)&(pCVar2->vertex_corners_).vector_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                  ) >> 2),(value_type_conflict1 *)&local_a0);
    pIVar14 = (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar14) {
      (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar14;
    }
    pCVar2 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::reserve(&(this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map,
              (long)((int)((ulong)((long)*(pointer *)
                                          ((long)&(pCVar2->corner_to_vertex_map_).vector_ + 8) -
                                   *(long *)&(pCVar2->corner_to_vertex_map_).vector_ >> 2) / 3) * 3)
             );
    pCVar2 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
              (&this->visited_vertex_ids_,
               (long)(int)((ulong)((long)*(pointer *)((long)&(pCVar2->vertex_corners_).vector_ + 8)
                                  - *(long *)&(pCVar2->vertex_corners_).vector_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                  ) >> 2),false);
    this_02 = local_70;
    piVar3 = (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar3) {
      (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar3;
    }
    this->last_encoded_symbol_id_ = -1;
    this->num_split_symbols_ = 0;
    pTVar4 = (this->topology_split_event_data_).
             super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->topology_split_event_data_).
        super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
        ._M_impl.super__Vector_impl_data._M_finish != pTVar4) {
      (this->topology_split_event_data_).
      super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar4;
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->face_to_split_symbol_map_)._M_h);
    pCVar2 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_a0._M_t.
    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
    super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&this->vertex_hole_id_,
               (long)(int)((ulong)((long)*(pointer *)((long)&(pCVar2->vertex_corners_).vector_ + 8)
                                  - *(long *)&(pCVar2->vertex_corners_).vector_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                  ) >> 2),(value_type_conflict1 *)&local_a0);
    this_01 = &this->processed_connectivity_corners_;
    pIVar14 = (this->processed_connectivity_corners_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->processed_connectivity_corners_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar14) {
      (this->processed_connectivity_corners_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar14;
    }
    pCVar2 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::reserve(this_01,(long)(int)((ulong)((long)*(pointer *)
                                                 ((long)&(pCVar2->corner_to_vertex_map_).vector_ + 8
                                                 ) -
                                          *(long *)&(pCVar2->corner_to_vertex_map_).vector_ >> 2) /
                                 3));
    (this->pos_encoding_data_).num_values = 0;
    bVar9 = FindHoles(this);
    if (bVar9) {
      bVar9 = InitAttributeData(this);
      if (bVar9) {
        local_a1 = (char)((uint)(*(int *)&(this->attribute_data_).
                                          super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                *(int *)&(this->attribute_data_).
                                         super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * '\x1b';
        pEVar5 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
        local_40 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)this_01;
        if (pEVar5->bit_encoder_reserved_bytes_ < 1) {
          std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                    ((vector<char,std::allocator<char>> *)pEVar5,
                     (pEVar5->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_a1,&local_a0);
          this_02 = local_70;
        }
        (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.num_attribute_data_ =
             (uint)local_a1;
        pCVar2 = (this->corner_table_)._M_t.
                 super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                 .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
        uVar17 = (ulong)((long)*(pointer *)((long)&(pCVar2->corner_to_vertex_map_).vector_ + 8) -
                        *(long *)&(pCVar2->corner_to_vertex_map_).vector_) >> 2;
        local_50 = this_00;
        MeshEdgebreakerTraversalEncoder::Start(&this_00->super_MeshEdgebreakerTraversalEncoder);
        local_68 = (CornerTable *)0x0;
        iStack_60._M_current = (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)0x0;
        local_58 = (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)0x0;
        local_38 = uVar17;
        if (0 < (int)uVar17) {
          local_48 = &this->vertex_traversal_length_;
          uVar19 = 0;
          do {
            uVar17 = (ulong)uVar19 / 3;
            uVar20 = (ulong)uVar19 / 0xc0;
            if ((((this_02->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar20] >>
                  (uVar17 & 0x3f) & 1) == 0) &&
               (bVar9 = CornerTable::IsDegenerated
                                  ((this->corner_table_)._M_t.
                                   super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                   .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,
                                   (FaceIndex)(uVar19 / 3)), !bVar9)) {
              local_74.value_ = 0;
              bVar9 = FindInitFaceConfiguration(this,(FaceIndex)(uVar19 / 3),&local_74);
              RAnsBitEncoder::EncodeBit((RAnsBitEncoder *)local_50,bVar9);
              this_02 = local_70;
              CVar15.value_ = local_74.value_;
              if (bVar9) {
                if (local_74.value_ == 0xffffffff) {
                  uVar12 = 0xffffffff;
                  uVar10 = 0xffffffff;
LAB_0013c15f:
                  uVar16 = 0xffffffff;
                }
                else {
                  lVar6 = *(long *)&(((this->corner_table_)._M_t.
                                      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                      .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                     _M_head_impl)->corner_to_vertex_map_).vector_;
                  uVar10 = local_74.value_ - 2;
                  if (0x55555555 < (local_74.value_ + 1) * -0x55555555) {
                    uVar10 = local_74.value_ + 1;
                  }
                  if (uVar10 == 0xffffffff) {
                    uVar10 = 0xffffffff;
                  }
                  else {
                    uVar10 = *(uint *)(lVar6 + (ulong)uVar10 * 4);
                  }
                  uVar12 = *(uint *)(lVar6 + (ulong)local_74.value_ * 4);
                  if (local_74.value_ * -0x55555555 < 0x55555556) {
                    uVar16 = local_74.value_ + 2;
                    if (uVar16 == 0xffffffff) goto LAB_0013c15f;
                  }
                  else {
                    uVar16 = local_74.value_ - 1;
                  }
                  uVar16 = *(uint *)(lVar6 + (ulong)uVar16 * 4);
                }
                p_Var7 = (this->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>.
                         _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                p_Var7[uVar12 >> 6] = p_Var7[uVar12 >> 6] | 1L << ((byte)uVar12 & 0x3f);
                p_Var7[uVar10 >> 6] = p_Var7[uVar10 >> 6] | 1L << ((byte)uVar10 & 0x3f);
                p_Var7[uVar16 >> 6] = p_Var7[uVar16 >> 6] | 1L << ((byte)uVar16 & 0x3f);
                local_a0._M_t.
                super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ = 1;
                __position._M_current =
                     (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (local_48,__position,(int *)&local_a0);
                }
                else {
                  *__position._M_current = 1;
                  (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
                }
                puVar1 = (this_02->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + uVar20;
                *puVar1 = *puVar1 | 1L << ((byte)uVar17 & 0x3f);
                if (CVar15.value_ == 0xffffffff) {
                  local_a0._M_t.
                  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                  .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ =
                       0xffffffff;
                }
                else {
                  local_a0._M_t.
                  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                  .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ =
                       CVar15.value_ - 2;
                  if (0x55555555 < (CVar15.value_ + 1) * -0x55555555) {
                    local_a0._M_t.
                    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                    .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ =
                         CVar15.value_ + 1;
                  }
                }
                if (iStack_60._M_current == local_58) {
                  std::
                  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>
                            ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                              *)&local_68,iStack_60,
                             (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)&local_a0);
                }
                else {
                  (iStack_60._M_current)->value_ =
                       (uint)local_a0._M_t.
                             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                             .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
                  iStack_60._M_current = iStack_60._M_current + 1;
                }
                if (CVar15.value_ != 0xffffffff) {
                  uVar10 = CVar15.value_ - 2;
                  if (0x55555555 < (CVar15.value_ + 1) * -0x55555555) {
                    uVar10 = CVar15.value_ + 1;
                  }
                  if ((((uVar10 != 0xffffffff) &&
                       (CVar15.value_ =
                             *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                                  .
                                                  super__Head_base<0UL,_draco::CornerTable_*,_false>
                                                  ._M_head_impl)->opposite_corners_).vector_.
                                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                      + (ulong)uVar10 * 4), CVar15.value_ != 0xffffffff)) &&
                      ((*(ulong *)((long)(this_02->super__Bvector_base<std::allocator<bool>_>).
                                         _M_impl.super__Bvector_impl_data._M_start.
                                         super__Bit_iterator_base._M_p +
                                  (ulong)(CVar15.value_ / 0x18 & 0xfffffff8)) >>
                        ((ulong)CVar15.value_ / 3 & 0x3f) & 1) == 0)) &&
                     (bVar9 = EncodeConnectivityFromCorner(this,CVar15), !bVar9)) {
                    local_a0._M_t.
                    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                    .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
                         (tuple<draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)
                         local_90;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_a0,"Failed to encode mesh component.","");
                    local_80->code_ = DRACO_ERROR;
                    (local_80->error_msg_)._M_dataplus._M_p =
                         (pointer)&(local_80->error_msg_).field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_80->error_msg_,
                               local_a0._M_t.
                               super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                               .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,
                               local_98 +
                               (long)local_a0._M_t.
                                     super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                     .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                     _M_head_impl);
                    goto LAB_0013c530;
                  }
                }
              }
              else {
                if (local_74.value_ == 0xffffffff) {
                  CVar15.value_ = 0xffffffff;
                }
                else {
                  CVar15.value_ = local_74.value_ - 2;
                  if (0x55555555 < (local_74.value_ + 1) * -0x55555555) {
                    CVar15.value_ = local_74.value_ + 1;
                  }
                }
                EncodeHole(this,CVar15,true);
                bVar9 = EncodeConnectivityFromCorner(this,local_74);
                this_02 = local_70;
                if (!bVar9) {
                  local_a0._M_t.
                  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                  .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
                       (tuple<draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)
                       local_90;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_a0,"Failed to encode mesh component.","");
                  local_80->code_ = DRACO_ERROR;
                  (local_80->error_msg_)._M_dataplus._M_p = (pointer)&(local_80->error_msg_).field_2
                  ;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_80->error_msg_,
                             local_a0._M_t.
                             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                             .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,
                             local_98 +
                             (long)local_a0._M_t.
                                   super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                   .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl)
                  ;
                  goto LAB_0013c530;
                }
              }
            }
            uVar19 = uVar19 + 1;
          } while ((uint)local_38 != uVar19);
        }
        pIVar14 = (this->processed_connectivity_corners_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar8 = (this->processed_connectivity_corners_).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pIVar13 = pIVar8 + -1;
        if (pIVar14 < pIVar13 && pIVar14 != pIVar8) {
          do {
            pIVar11 = pIVar14 + 1;
            uVar19 = pIVar14->value_;
            pIVar14->value_ = pIVar13->value_;
            pIVar13->value_ = uVar19;
            pIVar13 = pIVar13 + -1;
            pIVar14 = pIVar11;
          } while (pIVar11 < pIVar13);
        }
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>*,std::vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>>>
                  (local_40,pIVar8,local_68,iStack_60._M_current);
        if ((this->attribute_data_).
            super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->attribute_data_).
            super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
                    (this_02,(ulong)(uint)((int)((ulong)((long)(this->mesh_->faces_).vector_.
                                                                                                                              
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->mesh_->faces_).vector_.
                                                                                                                
                                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                          -0x55555555),false);
          pIVar8 = (this->processed_connectivity_corners_).
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pIVar14 = (this->processed_connectivity_corners_).
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pIVar14 != pIVar8;
              pIVar14 = pIVar14 + 1) {
            EncodeAttributeConnectivitiesOnFace(this,(CornerIndex)pIVar14->value_);
          }
        }
        MeshEdgebreakerTraversalPredictiveEncoder::Done(local_50);
        EncodeVarint<unsigned_int>
                  ((this->traversal_encoder_).num_symbols_,
                   (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
        EncodeVarint<unsigned_int>
                  (this->num_split_symbols_,
                   (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
        bVar9 = EncodeSplitData(this);
        if (bVar9) {
          pEVar5 = (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_;
          if (pEVar5->bit_encoder_reserved_bytes_ < 1) {
            std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                      ((vector<char,std::allocator<char>> *)pEVar5,
                       (pEVar5->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish,
                       (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.
                       traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       *(pointer *)
                        ((long)&(this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.
                                traversal_buffer_.buffer_.
                                super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data + 8));
          }
          local_80->code_ = OK;
          (local_80->error_msg_)._M_dataplus._M_p = (pointer)&(local_80->error_msg_).field_2;
          (local_80->error_msg_)._M_string_length = 0;
          (local_80->error_msg_).field_2._M_local_buf[0] = '\0';
        }
        else {
          local_a0._M_t.
          super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
          super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
               (tuple<draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)local_90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,"Failed to encode split data.","");
          local_80->code_ = DRACO_ERROR;
          (local_80->error_msg_)._M_dataplus._M_p = (pointer)&(local_80->error_msg_).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80->error_msg_,
                     local_a0._M_t.
                     super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                     .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,
                     local_98 +
                     (long)local_a0._M_t.
                           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                           .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl);
LAB_0013c530:
          if (local_a0._M_t.
              super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
              .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl !=
              (_Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)
              local_90) {
            operator_delete((void *)local_a0._M_t.
                                    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                    .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl
                            ,local_90[0] + 1);
          }
        }
        if (local_68 == (CornerTable *)0x0) {
          return local_80;
        }
        uVar17 = (long)local_58 - (long)local_68;
        _Var18._M_head_impl = local_68;
        goto LAB_0013bddc;
      }
      local_a0._M_t.
      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
      super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
           (tuple<draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Failed to initialize attribute data.","");
      local_80->code_ = DRACO_ERROR;
      (local_80->error_msg_)._M_dataplus._M_p = (pointer)&(local_80->error_msg_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80->error_msg_,
                 local_a0._M_t.
                 super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                 .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,
                 local_98 +
                 (long)local_a0._M_t.
                       super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                       .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl);
    }
    else {
      local_a0._M_t.
      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
      super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
           (tuple<draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,"Failed to process mesh holes.","");
      local_80->code_ = DRACO_ERROR;
      (local_80->error_msg_)._M_dataplus._M_p = (pointer)&(local_80->error_msg_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80->error_msg_,
                 local_a0._M_t.
                 super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                 .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,
                 local_98 +
                 (long)local_a0._M_t.
                       super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                       .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl);
    }
  }
  if (local_a0._M_t.
      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
      super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl ==
      (_Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)local_90) {
    return local_80;
  }
  uVar17 = local_90[0] + 1;
  _Var18._M_head_impl =
       (CornerTable *)
       local_a0._M_t.
       super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
       super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
LAB_0013bddc:
  operator_delete(_Var18._M_head_impl,uVar17);
  return local_80;
}

Assistant:

Status MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivity() {
  // To encode the mesh, we need face connectivity data stored in a corner
  // table. To compute the connectivity we must use indices associated with
  // POSITION attribute, because they define which edges can be connected
  // together, unless the option |use_single_connectivity_| is set in which case
  // we break the mesh along attribute seams and use the same connectivity for
  // all attributes.
  if (use_single_connectivity_) {
    corner_table_ = CreateCornerTableFromAllAttributes(mesh_);
  } else {
    corner_table_ = CreateCornerTableFromPositionAttribute(mesh_);
  }
  if (corner_table_ == nullptr ||
      corner_table_->num_faces() == corner_table_->NumDegeneratedFaces()) {
    // Failed to construct the corner table.
    // TODO(ostava): Add better error reporting.
    return Status(Status::DRACO_ERROR, "All triangles are degenerate.");
  }

  traversal_encoder_.Init(this);

  // Also encode the total number of vertices that is going to be encoded.
  // This can be different from the mesh_->num_points() + num_new_vertices,
  // because some of the vertices of the input mesh can be ignored (e.g.
  // vertices on degenerated faces or isolated vertices not attached to any
  // face).
  const uint32_t num_vertices_to_be_encoded =
      corner_table_->num_vertices() - corner_table_->NumIsolatedVertices();
  EncodeVarint(num_vertices_to_be_encoded, encoder_->buffer());

  const uint32_t num_faces =
      corner_table_->num_faces() - corner_table_->NumDegeneratedFaces();
  EncodeVarint(num_faces, encoder_->buffer());

  // Reset encoder data that may have been initialized in previous runs.
  visited_faces_.assign(mesh_->num_faces(), false);
  pos_encoding_data_.vertex_to_encoded_attribute_value_index_map.assign(
      corner_table_->num_vertices(), -1);
  pos_encoding_data_.encoded_attribute_value_index_to_corner_map.clear();
  pos_encoding_data_.encoded_attribute_value_index_to_corner_map.reserve(
      corner_table_->num_faces() * 3);
  visited_vertex_ids_.assign(corner_table_->num_vertices(), false);
  vertex_traversal_length_.clear();
  last_encoded_symbol_id_ = -1;
  num_split_symbols_ = 0;
  topology_split_event_data_.clear();
  face_to_split_symbol_map_.clear();
  visited_holes_.clear();
  vertex_hole_id_.assign(corner_table_->num_vertices(), -1);
  processed_connectivity_corners_.clear();
  processed_connectivity_corners_.reserve(corner_table_->num_faces());
  pos_encoding_data_.num_values = 0;

  if (!FindHoles()) {
    return Status(Status::DRACO_ERROR, "Failed to process mesh holes.");
  }

  if (!InitAttributeData()) {
    return Status(Status::DRACO_ERROR, "Failed to initialize attribute data.");
  }

  const uint8_t num_attribute_data =
      static_cast<uint8_t>(attribute_data_.size());
  encoder_->buffer()->Encode(num_attribute_data);
  traversal_encoder_.SetNumAttributeData(num_attribute_data);

  const int num_corners = corner_table_->num_corners();

  traversal_encoder_.Start();

  std::vector<CornerIndex> init_face_connectivity_corners;
  // Traverse the surface starting from each unvisited corner.
  for (int c_id = 0; c_id < num_corners; ++c_id) {
    CornerIndex corner_index(c_id);
    const FaceIndex face_id = corner_table_->Face(corner_index);
    if (visited_faces_[face_id.value()]) {
      continue;  // Face has been already processed.
    }
    if (corner_table_->IsDegenerated(face_id)) {
      continue;  // Ignore degenerated faces.
    }

    CornerIndex start_corner;
    const bool interior_config =
        FindInitFaceConfiguration(face_id, &start_corner);
    traversal_encoder_.EncodeStartFaceConfiguration(interior_config);

    if (interior_config) {
      // Select the correct vertex on the face as the root.
      corner_index = start_corner;
      const VertexIndex vert_id = corner_table_->Vertex(corner_index);
      // Mark all vertices of a given face as visited.
      const VertexIndex next_vert_id =
          corner_table_->Vertex(corner_table_->Next(corner_index));
      const VertexIndex prev_vert_id =
          corner_table_->Vertex(corner_table_->Previous(corner_index));

      visited_vertex_ids_[vert_id.value()] = true;
      visited_vertex_ids_[next_vert_id.value()] = true;
      visited_vertex_ids_[prev_vert_id.value()] = true;
      // New traversal started. Initiate it's length with the first vertex.
      vertex_traversal_length_.push_back(1);

      // Mark the face as visited.
      visited_faces_[face_id.value()] = true;
      // Start compressing from the opposite face of the "next" corner. This way
      // the first encoded corner corresponds to the tip corner of the regular
      // edgebreaker traversal (essentially the initial face can be then viewed
      // as a TOPOLOGY_C face).
      init_face_connectivity_corners.push_back(
          corner_table_->Next(corner_index));
      const CornerIndex opp_id =
          corner_table_->Opposite(corner_table_->Next(corner_index));
      const FaceIndex opp_face_id = corner_table_->Face(opp_id);
      if (opp_face_id != kInvalidFaceIndex &&
          !visited_faces_[opp_face_id.value()]) {
        if (!EncodeConnectivityFromCorner(opp_id)) {
          return Status(Status::DRACO_ERROR,
                        "Failed to encode mesh component.");
        }
      }
    } else {
      // Boundary configuration. We start on a boundary rather than on a face.
      // First encode the hole that's opposite to the start_corner.
      EncodeHole(corner_table_->Next(start_corner), true);
      // Start processing the face opposite to the boundary edge (the face
      // containing the start_corner).
      if (!EncodeConnectivityFromCorner(start_corner)) {
        return Status(Status::DRACO_ERROR, "Failed to encode mesh component.");
      }
    }
  }
  // Reverse the order of connectivity corners to match the order in which
  // they are going to be decoded.
  std::reverse(processed_connectivity_corners_.begin(),
               processed_connectivity_corners_.end());
  // Append the init face connectivity corners (which are processed in order by
  // the decoder after the regular corners.
  processed_connectivity_corners_.insert(processed_connectivity_corners_.end(),
                                         init_face_connectivity_corners.begin(),
                                         init_face_connectivity_corners.end());
  // Encode connectivity for all non-position attributes.
  if (!attribute_data_.empty()) {
    // Use the same order of corner that will be used by the decoder.
    visited_faces_.assign(mesh_->num_faces(), false);
    for (CornerIndex ci : processed_connectivity_corners_) {
      EncodeAttributeConnectivitiesOnFace(ci);
    }
  }
  traversal_encoder_.Done();

  // Encode the number of symbols.
  const uint32_t num_encoded_symbols =
      static_cast<uint32_t>(traversal_encoder_.NumEncodedSymbols());
  EncodeVarint(num_encoded_symbols, encoder_->buffer());

  // Encode the number of split symbols.
  EncodeVarint(num_split_symbols_, encoder_->buffer());

  // Append the traversal buffer.
  if (!EncodeSplitData()) {
    return Status(Status::DRACO_ERROR, "Failed to encode split data.");
  }
  encoder_->buffer()->Encode(traversal_encoder_.buffer().data(),
                             traversal_encoder_.buffer().size());

  return OkStatus();
}